

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_SecureChannelManager_cleanupTimedOut(UA_SecureChannelManager *cm,UA_DateTime nowMonotonic)

{
  channel_list_entry *pcVar1;
  UA_Connection *pUVar2;
  UA_DateTime UVar3;
  undefined4 uVar4;
  UA_UInt32 UVar5;
  ulong uVar6;
  UA_Logger logger;
  channel_list_entry *entry;
  
  pcVar1 = (cm->channels).lh_first;
  do {
    while( true ) {
      entry = pcVar1;
      if (entry == (channel_list_entry *)0x0) {
        return;
      }
      pcVar1 = (entry->pointers).le_next;
      pUVar2 = (entry->channel).connection;
      if (nowMonotonic <=
          (long)((ulong)(entry->channel).securityToken.revisedLifetime * 10000 +
                (entry->channel).securityToken.createdAt)) break;
      logger = (cm->server->config).logger;
      if (pUVar2 == (UA_Connection *)0x0) {
LAB_00119ad8:
        uVar6 = 0;
      }
      else {
        uVar6 = (ulong)(uint)pUVar2->sockfd;
      }
      UA_LOG_INFO(logger,UA_LOGCATEGORY_SECURECHANNEL,
                  "Connection %i | SecureChannel %i | SecureChannel has timed out",uVar6,
                  (ulong)(entry->channel).securityToken.channelId);
      removeSecureChannel(cm,entry);
    }
    if (pUVar2 == (UA_Connection *)0x0) {
      logger = (cm->server->config).logger;
      goto LAB_00119ad8;
    }
    if ((entry->channel).nextSecurityToken.tokenId != 0) {
      uVar4 = *(undefined4 *)&(entry->channel).nextSecurityToken.field_0x14;
      (entry->channel).securityToken.revisedLifetime =
           (entry->channel).nextSecurityToken.revisedLifetime;
      *(undefined4 *)&(entry->channel).securityToken.field_0x14 = uVar4;
      UVar5 = (entry->channel).nextSecurityToken.tokenId;
      UVar3 = (entry->channel).nextSecurityToken.createdAt;
      (entry->channel).securityToken.channelId = (entry->channel).nextSecurityToken.channelId;
      (entry->channel).securityToken.tokenId = UVar5;
      (entry->channel).securityToken.createdAt = UVar3;
      (entry->channel).nextSecurityToken.channelId = 0;
      (entry->channel).nextSecurityToken.tokenId = 0;
      (entry->channel).nextSecurityToken.createdAt = 0;
      *(undefined8 *)&(entry->channel).nextSecurityToken.revisedLifetime = 0;
    }
  } while( true );
}

Assistant:

void
UA_SecureChannelManager_cleanupTimedOut(UA_SecureChannelManager *cm, UA_DateTime nowMonotonic) {
    channel_list_entry *entry, *temp;
    LIST_FOREACH_SAFE(entry, &cm->channels, pointers, temp) {
        UA_DateTime timeout = entry->channel.securityToken.createdAt +
            (UA_DateTime)(entry->channel.securityToken.revisedLifetime * UA_MSEC_TO_DATETIME);
        if(timeout < nowMonotonic || !entry->channel.connection) {
            UA_LOG_INFO_CHANNEL(cm->server->config.logger, &entry->channel,
                                "SecureChannel has timed out");
            removeSecureChannel(cm, entry);
        } else if(entry->channel.nextSecurityToken.tokenId > 0) {
            UA_SecureChannel_revolveTokens(&entry->channel);
        }
    }
}